

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v7::detail::
     handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>&>
               (char spec,
               int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *handler)

{
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *in_RSI;
  char in_DIL;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *unaff_retaddr;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *in_stack_00000050;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *in_stack_00000390;
  
  if (in_DIL == '\0') {
LAB_0028ecc7:
    int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_dec
              (in_stack_00000050);
    return;
  }
  if (in_DIL == 'B') {
LAB_0028ecdf:
    int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_bin
              (in_stack_00000050);
  }
  else {
    if (in_DIL == 'L') {
      int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
                (in_stack_00000390);
      return;
    }
    if (in_DIL != 'X') {
      if (in_DIL == 'b') goto LAB_0028ecdf;
      if (in_DIL == 'c') {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_chr(in_RSI);
        return;
      }
      if (in_DIL == 'd') goto LAB_0028ecc7;
      if (in_DIL == 'o') {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_oct
                  (in_stack_00000050);
        return;
      }
      if (in_DIL != 'x') {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_error
                  (unaff_retaddr);
      }
    }
    int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_hex
              (in_stack_00000050);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
#ifdef FMT_DEPRECATED_N_SPECIFIER
  case 'n':
#endif
  case 'L':
    handler.on_num();
    break;
  case 'c':
    handler.on_chr();
    break;
  default:
    handler.on_error();
  }
}